

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void iobuf_resize(iobuf *io,size_t new_size)

{
  char *pcVar1;
  
  if ((io->size < new_size) || ((new_size < io->size && (io->len <= new_size)))) {
    pcVar1 = (char *)realloc(io->buf,new_size);
    if (pcVar1 != (char *)0x0) {
      io->size = new_size;
      io->buf = pcVar1;
    }
  }
  return;
}

Assistant:

void iobuf_resize(struct iobuf *io, size_t new_size) {
  char *p;
  if ((new_size > io->size || (new_size < io->size && new_size >= io->len)) &&
      (p = (char *) NS_REALLOC(io->buf, new_size)) != NULL) {
    io->size = new_size;
    io->buf = p;
  }
}